

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.cpp
# Opt level: O3

bool __thiscall
BufferedFileReader::openStream
          (BufferedFileReader *this,int readerID,char *streamName,int pid,CodecInfo *codecInfo)

{
  char *pcVar1;
  int iVar2;
  ReaderData *pRVar3;
  
  pRVar3 = BufferedReader::getReader(&this->super_BufferedReader,readerID);
  if ((pRVar3 != (ReaderData *)0x0) &&
     (pRVar3->_vptr_ReaderData == (_func_int **)&PTR__FileReaderData_0023d038)) {
    pRVar3->m_firstBlock = true;
    pRVar3->m_lastBlock = false;
    pcVar1 = (char *)(pRVar3->m_streamName)._M_string_length;
    strlen(streamName);
    iVar2 = 0;
    std::__cxx11::string::_M_replace((ulong)&pRVar3->m_streamName,0,pcVar1,(ulong)streamName);
    *(undefined4 *)&pRVar3[1].m_streamName._M_dataplus._M_p = 0;
    File::close((File *)(pRVar3 + 1),iVar2);
    (*pRVar3->_vptr_ReaderData[3])(pRVar3);
    iVar2 = File::open((File *)(pRVar3 + 1),(pRVar3->m_streamName)._M_dataplus._M_p,1,0);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool BufferedFileReader::openStream(const int readerID, const char* streamName, int pid, const CodecInfo* codecInfo)
{
    const auto data = dynamic_cast<FileReaderData*>(getReader(readerID));

    if (data == nullptr)
    {
        LTRACE(LT_ERROR, 0, "Unknown readerID " << readerID);
        return false;
    }
    data->m_firstBlock = true;
    data->m_lastBlock = false;
    data->m_streamName = streamName;
    data->m_fileHeaderSize = 0;
    data->closeStream();
    if (!data->openStream())
    {
        return false;
    }
    return true;
}